

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containsmulti_benchmark.c
# Opt level: O3

int main(int argc,char **argv)

{
  char *pcVar1;
  roaring_bitmap_t *prVar2;
  uint uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  ulong uVar6;
  void *pvVar7;
  FILE *__stream;
  size_t sVar8;
  size_t sVar9;
  uint32_t *vals;
  ulong uVar10;
  uint64_t uVar11;
  long lVar12;
  long lVar13;
  char cVar14;
  byte bVar15;
  uint uVar16;
  int p;
  long lVar17;
  undefined1 *puVar18;
  char **ppcVar19;
  ulong n_args;
  undefined1 *puVar20;
  ulong uVar21;
  long lVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined8 uStack_a0;
  undefined1 auStack_98 [8];
  undefined1 *local_90;
  ulong local_88;
  void *local_80;
  undefined1 *local_78;
  roaring_bitmap_t *local_70;
  undefined1 *local_68;
  void *local_60;
  undefined1 *local_58;
  char **local_50;
  undefined1 auStack_48 [8];
  timespec ts;
  
  local_90 = auStack_98;
  if (argc < 2) {
    uStack_a0 = 0x10131c;
    printf("Usage: %s <comma_separated_integers_file> ...\n",*argv);
    uStack_a0 = 0x10132d;
    printf("Example: %s ~/CRoaring/benchmarks/realdata/weather_sept_85/*\n",*argv);
    return 1;
  }
  local_88 = (ulong)(argc - 1);
  local_60 = (void *)(ulong)(uint)argc;
  uVar6 = (long)local_60 * 8 + 0xfU & 0xfffffffffffffff0;
  puVar20 = auStack_98 + -uVar6 + -uVar6;
  *(undefined8 *)(puVar20 + -8) = 0x10137a;
  local_70 = roaring_bitmap_create_with_capacity(0);
  pvVar7 = (void *)0x1;
  local_78 = puVar20;
  local_68 = auStack_98 + -uVar6;
  local_50 = argv;
LAB_00101392:
  pcVar1 = local_50[(long)pvVar7];
  local_58 = (undefined1 *)pvVar7;
  *(undefined8 *)(puVar20 + -8) = 0x1013a9;
  __stream = fopen(pcVar1,"r");
  if (__stream == (FILE *)0x0) {
    *(undefined8 *)(puVar20 + -8) = 0x101b38;
    printf("Could not open file %s\n",pcVar1);
  }
  else {
    *(undefined8 *)(puVar20 + -8) = 0x1013c4;
    fseek(__stream,0,2);
    *(undefined8 *)(puVar20 + -8) = 0x1013cc;
    sVar8 = ftell(__stream);
    *(undefined8 *)(puVar20 + -8) = 0x1013d7;
    rewind(__stream);
    *(undefined8 *)(puVar20 + -8) = 0x1013e0;
    pvVar7 = malloc(sVar8 + 1);
    if (pvVar7 == (void *)0x0) {
      *(undefined8 *)(puVar20 + -8) = 0x101b42;
      fclose(__stream);
    }
    else {
      *(undefined8 *)(puVar20 + -8) = 0x1013ff;
      sVar9 = fread(pvVar7,sVar8,1,__stream);
      if (sVar9 == 1) {
        *(undefined1 *)((long)pvVar7 + sVar8) = 0;
        *(undefined8 *)(puVar20 + -8) = 0x101416;
        fclose(__stream);
        uVar21 = 1;
        uVar6 = 0;
        do {
          if (*(char *)((long)pvVar7 + uVar6) == ',') {
            uVar21 = uVar21 + 1;
          }
          else if (*(char *)((long)pvVar7 + uVar6) == '\0') goto LAB_00101436;
          uVar6 = uVar6 + 1;
        } while( true );
      }
      *(undefined8 *)(puVar20 + -8) = 0x101b4c;
      free(pvVar7);
    }
  }
  goto LAB_00101b4c;
LAB_00101436:
  *(undefined8 *)(puVar20 + -8) = 0x101443;
  vals = (uint32_t *)malloc(uVar21 * 4);
  if (vals != (uint32_t *)0x0) {
    if (uVar6 == 0) {
      n_args = 0;
    }
    else {
      uVar10 = 0;
      n_args = 0;
      do {
        cVar14 = *(char *)((long)pvVar7 + uVar10);
        while( true ) {
          if (cVar14 == '\0') goto LAB_001014b8;
          if (0xf5 < (byte)(cVar14 - 0x3aU)) break;
          cVar14 = *(char *)((long)pvVar7 + uVar10 + 1);
          uVar10 = uVar10 + 1;
        }
        uVar4 = (uint32_t)(byte)(cVar14 - 0x30);
        cVar14 = *(char *)((long)pvVar7 + uVar10 + 1);
        while ((byte)(cVar14 - 0x30U) < 10) {
          uVar4 = (uint)(byte)(cVar14 - 0x30) + uVar4 * 10;
          lVar17 = uVar10 + 2;
          uVar10 = uVar10 + 1;
          cVar14 = *(char *)((long)pvVar7 + lVar17);
        }
        vals[n_args] = uVar4;
        n_args = n_args + 1;
        uVar10 = uVar10 + 2;
      } while (uVar10 < uVar6);
    }
LAB_001014b8:
    if (n_args != uVar21) {
      *(undefined8 *)(puVar20 + -8) = 0x1014d3;
      printf("unexpected number of integers! %d %d \n",n_args & 0xffffffff,uVar21 & 0xffffffff);
    }
    *(undefined8 *)(puVar20 + -8) = 0x1014db;
    free(pvVar7);
    prVar2 = local_70;
    if (n_args != 0) {
      *(undefined8 *)(puVar20 + -8) = 0x1014f6;
      roaring_bitmap_add_many(prVar2,n_args,vals);
      puVar18 = local_78;
      if ((n_args & 0xfffffffe) != 0) {
        uVar6 = n_args & 0xffffffff;
        do {
          uVar3 = (uint)(pcg32_global_0 >> 0x2d) ^ (uint)(pcg32_global_0 >> 0x1b);
          bVar15 = (byte)(pcg32_global_0 >> 0x3b);
          uVar3 = uVar3 >> bVar15 | uVar3 << 0x20 - bVar15;
          uVar21 = (ulong)uVar3;
          pcg32_global_0 = pcg32_global_0 * 0x5851f42d4c957f2d + 0xda3e39cb94b95bdb;
          uVar16 = (uint)uVar6 - 1;
          if (((uint)uVar6 & uVar16) == 0) {
            uVar21 = (ulong)(uVar3 & uVar16);
          }
          else if (uVar6 < 0x80000001) {
            uVar21 = uVar6 * uVar21;
            uVar3 = (uint)uVar21;
            if ((uVar21 & 0xffffffff) < uVar6) {
              while (uVar3 <= (uint)(0xffffffff % (uVar6 & 0xffffffff))) {
                uVar3 = (uint)(pcg32_global_0 >> 0x2d) ^ (uint)(pcg32_global_0 >> 0x1b);
                bVar15 = (byte)(pcg32_global_0 >> 0x3b);
                pcg32_global_0 = pcg32_global_0 * 0x5851f42d4c957f2d + 0xda3e39cb94b95bdb;
                uVar21 = (uVar3 >> bVar15 | uVar3 << 0x20 - bVar15) * uVar6;
                uVar3 = (uint)uVar21;
              }
            }
            uVar21 = uVar21 >> 0x20;
          }
          else {
            while (uVar6 <= uVar21) {
              uVar3 = (uint)(pcg32_global_0 >> 0x2d) ^ (uint)(pcg32_global_0 >> 0x1b);
              bVar15 = (byte)(pcg32_global_0 >> 0x3b);
              pcg32_global_0 = pcg32_global_0 * 0x5851f42d4c957f2d + 0xda3e39cb94b95bdb;
              uVar21 = (ulong)(uVar3 >> bVar15 | uVar3 << 0x20 - bVar15);
            }
          }
          uVar4 = vals[uVar6 - 1];
          vals[uVar6 - 1] = vals[uVar21];
          uVar6 = uVar6 - 1;
          vals[uVar21] = uVar4;
        } while (1 < uVar6);
      }
      *(uint32_t **)(local_68 + (long)local_58 * 8 + -8) = vals;
      *(ulong *)(local_78 + (long)local_58 * 8 + -8) = n_args;
      pvVar7 = (void *)((long)local_58 + 1);
      if (pvVar7 == local_60) {
        *(undefined8 *)(puVar20 + -8) = 0x101643;
        puts("Data:");
        *(undefined8 *)(puVar20 + -8) = 0x10164b;
        uVar11 = roaring_bitmap_get_cardinality(prVar2);
        lVar17 = 0;
        *(undefined8 *)(puVar20 + -8) = 0x10165e;
        printf("  cardinality: %lu\n",uVar11);
        uVar3 = (prVar2->high_low_container).size;
        *(undefined8 *)(puVar20 + -8) = 0x10166f;
        printf("  buckets: %d\n",(ulong)uVar3);
        *(undefined8 *)(puVar20 + -8) = 0x101677;
        uVar4 = roaring_bitmap_minimum(prVar2);
        *(undefined8 *)(puVar20 + -8) = 0x101686;
        uVar5 = roaring_bitmap_maximum(prVar2);
        *(undefined8 *)(puVar20 + -8) = 0x10169c;
        printf("  range: %u-%u\n",(ulong)(uVar4 >> 0x10),(ulong)(uVar5 >> 0x10));
        *(undefined8 *)(puVar20 + -8) = 0x1016af;
        printf("Cycles/element: %d\n",10);
        *(undefined8 *)(puVar20 + -8) = 0x1016bd;
        printf("                          roaring_bitmap_contains:");
        do {
          lVar13 = *(long *)(puVar18 + lVar17 * 8);
          local_58 = puVar20;
          *(undefined8 *)(puVar20 + -8) = 0x1016d7;
          clock_gettime(3,(timespec *)auStack_48);
          prVar2 = local_70;
          local_60 = (void *)auStack_48;
          local_50 = (char **)ts.tv_sec;
          if (lVar13 != 0) {
            lVar12 = *(long *)(local_68 + lVar17 * 8);
            lVar22 = 0;
            do {
              uVar4 = *(uint32_t *)(lVar12 + lVar22 * 4);
              *(undefined8 *)(puVar20 + -8) = 0x101707;
              roaring_bitmap_contains(prVar2,uVar4);
              lVar22 = lVar22 + 1;
            } while (lVar13 != lVar22);
          }
          *(undefined8 *)(puVar20 + -8) = 0x101720;
          clock_gettime(3,(timespec *)auStack_48);
          lVar12 = ((long)auStack_48 - (long)local_60) * 1000000000 + (ts.tv_sec - (long)local_50);
          auVar23._8_4_ = (int)((ulong)lVar12 >> 0x20);
          auVar23._0_8_ = lVar12;
          auVar23._12_4_ = 0x45300000;
          auVar24._8_4_ = (int)((ulong)lVar13 >> 0x20);
          auVar24._0_8_ = lVar13;
          auVar24._12_4_ = 0x45300000;
          *(undefined8 *)(puVar20 + -8) = 0x10178e;
          printf(" %10f",((auVar23._8_8_ - 1.9342813113834067e+25) +
                         ((double)CONCAT44(0x43300000,(int)lVar12) - 4503599627370496.0)) /
                         ((auVar24._8_8_ - 1.9342813113834067e+25) +
                         ((double)CONCAT44(0x43300000,(int)lVar13) - 4503599627370496.0)));
          ppcVar19 = (char **)local_58;
          puVar18 = local_78;
          lVar17 = lVar17 + 1;
          puVar20 = local_58;
        } while (lVar17 != 10);
        *(undefined8 *)(local_58 + -8) = 0x1017ad;
        putchar(10);
        puVar20 = (undefined1 *)0x0;
        *(undefined8 *)((long)ppcVar19 + -8) = 0x1017bd;
        printf("                     roaring_bitmap_contains_bulk:");
        do {
          lVar17 = *(long *)(puVar18 + (long)puVar20 * 8);
          *(undefined8 *)((long)ppcVar19 + -8) = 0x1017d3;
          local_50 = ppcVar19;
          clock_gettime(3,(timespec *)auStack_48);
          prVar2 = local_70;
          local_80 = (void *)auStack_48;
          local_60 = (void *)ts.tv_sec;
          lVar13 = *(long *)(local_68 + (long)puVar20 * 8);
          auStack_48 = (undefined1  [8])0x0;
          ts.tv_sec = 0;
          local_58 = puVar20;
          if (lVar17 != 0) {
            lVar12 = 0;
            do {
              uVar4 = *(uint32_t *)(lVar13 + lVar12 * 4);
              *(undefined8 *)((long)ppcVar19 + -8) = 0x101813;
              roaring_bitmap_contains_bulk(prVar2,(roaring_bulk_context_t *)auStack_48,uVar4);
              lVar12 = lVar12 + 1;
            } while (lVar17 != lVar12);
          }
          *(undefined8 *)((long)ppcVar19 + -8) = 0x101828;
          clock_gettime(3,(timespec *)auStack_48);
          lVar13 = ((long)auStack_48 - (long)local_80) * 1000000000 + (ts.tv_sec - (long)local_60);
          auVar25._8_4_ = (int)((ulong)lVar13 >> 0x20);
          auVar25._0_8_ = lVar13;
          auVar25._12_4_ = 0x45300000;
          auVar26._8_4_ = (int)((ulong)lVar17 >> 0x20);
          auVar26._0_8_ = lVar17;
          auVar26._12_4_ = 0x45300000;
          *(undefined8 *)((long)ppcVar19 + -8) = 0x101896;
          printf(" %10f",((auVar25._8_8_ - 1.9342813113834067e+25) +
                         ((double)CONCAT44(0x43300000,(int)lVar13) - 4503599627370496.0)) /
                         ((auVar26._8_8_ - 1.9342813113834067e+25) +
                         ((double)CONCAT44(0x43300000,(int)lVar17) - 4503599627370496.0)));
          ppcVar19 = local_50;
          puVar18 = local_78;
          puVar20 = local_58 + 1;
        } while (puVar20 != (undefined1 *)0xa);
        *(undefined8 *)((long)local_50 + -8) = 0x1018b9;
        putchar(10);
        puVar20 = local_68;
        uVar6 = local_88;
        if (local_88 != 0) {
          uVar21 = 0;
          do {
            pvVar7 = *(void **)(puVar20 + uVar21 * 8);
            sVar8 = *(size_t *)(puVar18 + uVar21 * 8);
            *(undefined8 *)((long)ppcVar19 + -8) = 0x1018e5;
            qsort(pvVar7,sVar8,4,compare_uint32);
            uVar21 = uVar21 + 1;
          } while (uVar6 != uVar21);
        }
        lVar17 = 0;
        *(undefined8 *)((long)ppcVar19 + -8) = 0x1018fd;
        printf("        roaring_bitmap_contains with sorted input:");
        do {
          lVar13 = *(long *)(puVar18 + lVar17 * 8);
          *(undefined8 *)((long)ppcVar19 + -8) = 0x101917;
          local_58 = (undefined1 *)ppcVar19;
          clock_gettime(3,(timespec *)auStack_48);
          prVar2 = local_70;
          local_60 = (void *)auStack_48;
          local_50 = (char **)ts.tv_sec;
          if (lVar13 != 0) {
            lVar12 = *(long *)(local_68 + lVar17 * 8);
            lVar22 = 0;
            do {
              uVar4 = *(uint32_t *)(lVar12 + lVar22 * 4);
              *(undefined8 *)((long)ppcVar19 + -8) = 0x101947;
              roaring_bitmap_contains(prVar2,uVar4);
              lVar22 = lVar22 + 1;
            } while (lVar13 != lVar22);
          }
          *(undefined8 *)((long)ppcVar19 + -8) = 0x101960;
          clock_gettime(3,(timespec *)auStack_48);
          lVar12 = ((long)auStack_48 - (long)local_60) * 1000000000 + (ts.tv_sec - (long)local_50);
          auVar27._8_4_ = (int)((ulong)lVar12 >> 0x20);
          auVar27._0_8_ = lVar12;
          auVar27._12_4_ = 0x45300000;
          auVar28._8_4_ = (int)((ulong)lVar13 >> 0x20);
          auVar28._0_8_ = lVar13;
          auVar28._12_4_ = 0x45300000;
          *(undefined8 *)((long)ppcVar19 + -8) = 0x1019ce;
          printf(" %10f",((auVar27._8_8_ - 1.9342813113834067e+25) +
                         ((double)CONCAT44(0x43300000,(int)lVar12) - 4503599627370496.0)) /
                         ((auVar28._8_8_ - 1.9342813113834067e+25) +
                         ((double)CONCAT44(0x43300000,(int)lVar13) - 4503599627370496.0)));
          ppcVar19 = (char **)local_58;
          puVar20 = local_78;
          lVar17 = lVar17 + 1;
          puVar18 = local_78;
        } while (lVar17 != 10);
        *(undefined8 *)(local_58 + -8) = 0x1019ed;
        putchar(10);
        puVar18 = (undefined1 *)0x0;
        *(undefined8 *)((long)ppcVar19 + -8) = 0x1019fd;
        printf("   roaring_bitmap_contains_bulk with sorted input:");
        do {
          lVar17 = *(long *)(puVar20 + (long)puVar18 * 8);
          *(undefined8 *)((long)ppcVar19 + -8) = 0x101a13;
          local_50 = ppcVar19;
          clock_gettime(3,(timespec *)auStack_48);
          prVar2 = local_70;
          local_80 = (void *)auStack_48;
          local_60 = (void *)ts.tv_sec;
          lVar13 = *(long *)(local_68 + (long)puVar18 * 8);
          auStack_48 = (undefined1  [8])0x0;
          ts.tv_sec = 0;
          local_58 = puVar18;
          if (lVar17 != 0) {
            lVar12 = 0;
            do {
              uVar4 = *(uint32_t *)(lVar13 + lVar12 * 4);
              *(undefined8 *)((long)ppcVar19 + -8) = 0x101a53;
              roaring_bitmap_contains_bulk(prVar2,(roaring_bulk_context_t *)auStack_48,uVar4);
              lVar12 = lVar12 + 1;
            } while (lVar17 != lVar12);
          }
          *(undefined8 *)((long)ppcVar19 + -8) = 0x101a68;
          clock_gettime(3,(timespec *)auStack_48);
          lVar13 = ((long)auStack_48 - (long)local_80) * 1000000000 + (ts.tv_sec - (long)local_60);
          auVar29._8_4_ = (int)((ulong)lVar13 >> 0x20);
          auVar29._0_8_ = lVar13;
          auVar29._12_4_ = 0x45300000;
          auVar30._8_4_ = (int)((ulong)lVar17 >> 0x20);
          auVar30._0_8_ = lVar17;
          auVar30._12_4_ = 0x45300000;
          *(undefined8 *)((long)ppcVar19 + -8) = 0x101ad6;
          printf(" %10f",((auVar29._8_8_ - 1.9342813113834067e+25) +
                         ((double)CONCAT44(0x43300000,(int)lVar13) - 4503599627370496.0)) /
                         ((auVar30._8_8_ - 1.9342813113834067e+25) +
                         ((double)CONCAT44(0x43300000,(int)lVar17) - 4503599627370496.0)));
          ppcVar19 = local_50;
          puVar18 = local_58 + 1;
          puVar20 = local_78;
        } while (puVar18 != (undefined1 *)0xa);
        *(undefined8 *)((long)local_50 + -8) = 0x101af9;
        putchar(10);
        prVar2 = local_70;
        *(undefined8 *)((long)ppcVar19 + -8) = 0x101b02;
        roaring_bitmap_free(prVar2);
        puVar20 = local_68;
        uVar6 = local_88;
        if ((int)local_88 == 0) {
          return 0;
        }
        uVar21 = 0;
        do {
          pvVar7 = *(void **)(puVar20 + uVar21 * 8);
          *(undefined8 *)((long)ppcVar19 + -8) = 0x101b1d;
          free(pvVar7);
          uVar21 = uVar21 + 1;
        } while (uVar6 != uVar21);
        return 0;
      }
      goto LAB_00101392;
    }
  }
LAB_00101b4c:
  pcVar1 = local_50[(long)local_58];
  *(undefined8 *)(puVar20 + -8) = 0x101b66;
  printf("No integers found in %s\n",pcVar1);
  return 1;
}

Assistant:

int main(int argc, char* argv[]) {
    (void)&read_all_integer_files;  // suppress unused warning

    if (argc < 2) {
        printf("Usage: %s <comma_separated_integers_file> ...\n", argv[0]);
        printf("Example: %s ~/CRoaring/benchmarks/realdata/weather_sept_85/*\n",
               argv[0]);
        return 1;
    }

    size_t fields = argc - 1;
    uint32_t* values[argc];
    size_t count[argc];

    roaring_bitmap_t* bm = roaring_bitmap_create();
    for (int i = 1; i < argc; i++) {
        size_t t_count = 0;
        uint32_t* t_values = read_integer_file(argv[i], &t_count);
        if (t_count == 0) {
            printf("No integers found in %s\n", argv[i]);
            return 1;
        }
        roaring_bitmap_add_many(bm, t_count, t_values);

        shuffle_uint32(t_values, t_count);

        values[i - 1] = t_values;
        count[i - 1] = t_count;
    }
    // roaring_bitmap_run_optimize(bm);

    printf("Data:\n");
    printf("  cardinality: %" PRIu64 "\n", roaring_bitmap_get_cardinality(bm));
    printf("  buckets: %d\n", (int)bm->high_low_container.size);
    printf("  range: %" PRIu32 "-%" PRIu32 "\n",
           roaring_bitmap_minimum(bm) >> 16, roaring_bitmap_maximum(bm) >> 16);

    const int num_passes = 10;
    printf("Cycles/element: %d\n", num_passes);
    uint64_t cycles_start, cycles_final;

    printf("                          roaring_bitmap_contains:");
    for (int p = 0; p < num_passes; p++) {
        bool result[count[p]];
        RDTSC_START(cycles_start);
        contains_multi_via_contains(bm, values[p], result, count[p]);
        RDTSC_FINAL(cycles_final);
        printf(" %10f", (cycles_final - cycles_start) * 1.0 / count[p]);
    }
    printf("\n");

    printf("                     roaring_bitmap_contains_bulk:");
    for (int p = 0; p < num_passes; p++) {
        bool result[count[p]];
        RDTSC_START(cycles_start);
        contains_multi_bulk(bm, values[p], result, count[p]);
        RDTSC_FINAL(cycles_final);
        printf(" %10f", (cycles_final - cycles_start) * 1.0 / count[p]);
    }
    printf("\n");

    // sort input array
    for (size_t i = 0; i < fields; ++i) {
        qsort(values[i], count[i], sizeof(uint32_t), compare_uint32);
    }

    printf("        roaring_bitmap_contains with sorted input:");
    for (int p = 0; p < num_passes; p++) {
        bool result[count[p]];
        RDTSC_START(cycles_start);
        contains_multi_via_contains(bm, values[p], result, count[p]);
        RDTSC_FINAL(cycles_final);
        printf(" %10f", (cycles_final - cycles_start) * 1.0 / count[p]);
    }
    printf("\n");

    printf("   roaring_bitmap_contains_bulk with sorted input:");
    for (int p = 0; p < num_passes; p++) {
        bool result[count[p]];
        RDTSC_START(cycles_start);
        contains_multi_bulk(bm, values[p], result, count[p]);
        RDTSC_FINAL(cycles_final);
        printf(" %10f", (cycles_final - cycles_start) * 1.0 / count[p]);
    }
    printf("\n");

    roaring_bitmap_free(bm);
    for (size_t i = 0; i < fields; ++i) {
        free(values[i]);
    }
    return 0;
}